

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     parallel_for<Omega_h::divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::__0>
               (LO n,type *f,char *name)

{
  undefined1 local_78 [8];
  type f2;
  IntIterator last;
  IntIterator first;
  char *name_local;
  type *f_local;
  LO n_local;
  
  f2.a.write_.shared_alloc_.direct_ptr._4_4_ = 0;
  f2.a.write_.shared_alloc_.direct_ptr._0_4_ = n;
  divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::__0((__0 *)local_78,f);
  for_each<Omega_h::IntIterator,Omega_h::divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::__0>
            (f2.a.write_.shared_alloc_.direct_ptr._4_4_,f2.a.write_.shared_alloc_.direct_ptr._0_4_,
             (type *)local_78);
  divide_each_maybe_zero(Omega_h::Read<double>,Omega_h::Read<double>)::$_0::~__0((__0 *)local_78);
  return;
}

Assistant:

void parallel_for(LO n, T const& f, char const* name = "") {
#if defined(OMEGA_H_USE_KOKKOS)
  if (n > 0) Kokkos::parallel_for(name, policy(n), f);
#else
  (void)name;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  auto f2 = f;
  ::Omega_h::for_each(first, last, std::move(f2));
#endif
}